

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::XmlReporter::listTags
          (XmlReporter *this,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong __val;
  bool bVar2;
  StringRef text;
  char cVar3;
  _Rb_tree_node_base *p_Var4;
  ulong uVar5;
  XmlFormatting fmt;
  XmlWriter *this_00;
  pointer pTVar6;
  char cVar7;
  char *__end;
  ScopedElement aliasTag;
  ScopedElement innerTag;
  ScopedElement outerTag;
  string local_a0;
  undefined1 local_80 [64];
  
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"TagsFromMatchingTests","");
  this_00 = &this->m_xml;
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,(XmlFormatting)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pTVar6 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_80._32_8_ =
       (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (pTVar6 != (pointer)local_80._32_8_) {
    do {
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Tag","");
      fmt = (XmlFormatting)&local_a0;
      XmlWriter::scopedElement((XmlWriter *)(local_80 + 0x30),(string *)this_00,fmt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Count","");
      XmlWriter::startElement(this_00,&local_a0,Indent);
      __val = pTVar6->count;
      cVar7 = '\x01';
      if (9 < __val) {
        uVar5 = __val;
        cVar3 = '\x04';
        do {
          cVar7 = cVar3;
          if (uVar5 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_00169ab6;
          }
          if (uVar5 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_00169ab6;
          }
          if (uVar5 < 10000) goto LAB_00169ab6;
          bVar2 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar3 = cVar7 + '\x04';
        } while (bVar2);
        cVar7 = cVar7 + '\x01';
      }
LAB_00169ab6:
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_80,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_80._0_8_,local_80._8_4_,__val);
      text.m_size._0_4_ = local_80._8_4_;
      text.m_start = (char *)local_80._0_8_;
      text.m_size._4_4_ = local_80._12_4_;
      XmlWriter::writeText(this_00,text,None);
      XmlWriter::endElement(this_00,Newline);
      if ((XmlWriter *)local_80._0_8_ != (XmlWriter *)(local_80 + 0x10)) {
        operator_delete((void *)local_80._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_80._16_8_)->_M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Aliases","");
      XmlWriter::scopedElement((XmlWriter *)local_80,(string *)this_00,fmt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_80._40_8_ = pTVar6;
      for (p_Var4 = (pTVar6->spellings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(pTVar6->spellings)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        local_a0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Alias","");
        XmlWriter::startElement(this_00,&local_a0,Indent);
        XmlWriter::writeText(this_00,*(StringRef *)(p_Var4 + 1),None);
        XmlWriter::endElement(this_00,Newline);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_80 + 0x30));
      pTVar6 = (pointer)(local_80._40_8_ + 0x38);
    } while (pTVar6 != (pointer)local_80._32_8_);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void XmlReporter::listTags(std::vector<TagInfo> const& tags) {
        auto outerTag = m_xml.scopedElement("TagsFromMatchingTests");
        for (auto const& tag : tags) {
            auto innerTag = m_xml.scopedElement("Tag");
            m_xml.startElement("Count", XmlFormatting::Indent)
                 .writeText(std::to_string(tag.count), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            auto aliasTag = m_xml.scopedElement("Aliases");
            for (auto const& alias : tag.spellings) {
                m_xml.startElement("Alias", XmlFormatting::Indent)
                     .writeText(alias, XmlFormatting::None)
                     .endElement(XmlFormatting::Newline);
            }
        }
    }